

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlDOMWrapReconcileNamespaces(xmlDOMWrapCtxtPtr_conflict ctxt,xmlNodePtr elem,int options)

{
  xmlChar *str2;
  _xmlDoc *node;
  bool bVar1;
  bool bVar2;
  xmlElementType xVar3;
  int iVar4;
  xmlNs *pxVar5;
  xmlNsMapItemPtr_conflict pxVar6;
  xmlNsPtr *ppxVar7;
  uint uVar8;
  _xmlNode *p_Var9;
  xmlNsMapItemPtr_conflict pxVar10;
  uint uVar11;
  xmlNsMapItemPtr pxVar12;
  _xmlDoc *p_Var13;
  xmlNodePtr elem_00;
  xmlNsPtr newNs;
  int iVar14;
  _xmlNode *p_Var15;
  xmlNs *pxVar16;
  xmlNsPtr *ppxVar17;
  bool bVar18;
  int in_stack_ffffffffffffff90;
  xmlNsMapPtr nsMap;
  xmlNs *local_60;
  int nbRedund;
  xmlNsPtr *listRedund;
  int local_48;
  int sizeRedund;
  xmlNodePtr local_40;
  _xmlDoc *local_38;
  
  nsMap = (xmlNsMapPtr)0x0;
  listRedund = (xmlNsPtr *)0x0;
  sizeRedund = 0;
  nbRedund = 0;
  local_48 = options;
  if (((elem == (xmlNodePtr)0x0) || (p_Var13 = elem->doc, p_Var13 == (_xmlDoc *)0x0)) ||
     (elem->type != XML_ELEMENT_NODE)) {
    return -1;
  }
  iVar14 = -1;
  xVar3 = XML_ELEMENT_NODE;
  bVar1 = false;
  elem_00 = (xmlNodePtr)0x0;
  uVar11 = 0;
  p_Var15 = elem;
  do {
    if (xVar3 == XML_ATTRIBUTE_NODE) {
LAB_0014b649:
      if (p_Var15->ns != (xmlNs *)0x0) {
        if (!bVar1) {
          node = (_xmlDoc *)elem->parent;
          if (((node != (_xmlDoc *)0x0) && (node->doc != node)) &&
             (iVar4 = xmlDOMWrapNSNormGatherInScopeNs(&nsMap,(xmlNodePtr)node), iVar4 == -1)) {
            uVar11 = 0xffffffff;
          }
          bVar1 = true;
        }
        if (listRedund != (xmlNsPtr *)0x0) {
          iVar4 = nbRedund;
          if (nbRedund < 1) {
            iVar4 = 0;
          }
          ppxVar7 = listRedund + 1;
          while (bVar18 = iVar4 != 0, iVar4 = iVar4 + -1, bVar18) {
            if (p_Var15->ns == ppxVar7[-1]) {
              p_Var15->ns = *ppxVar7;
              break;
            }
            ppxVar7 = ppxVar7 + 2;
          }
        }
        if ((nsMap != (xmlNsMapPtr)0x0) &&
           (pxVar6 = nsMap->first, pxVar6 != (xmlNsMapItemPtr_conflict)0x0)) {
          for (; pxVar6 != (xmlNsMapItemPtr_conflict)0x0; pxVar6 = pxVar6->next) {
            if ((pxVar6->shadowDepth == -1) && (p_Var15->ns == pxVar6->oldNs)) goto LAB_0014b72e;
          }
        }
        iVar4 = xmlDOMWrapNSNormAcquireNormalizedNs
                          (p_Var13,elem_00,p_Var15->ns,&local_60,&nsMap,iVar14,
                           (uint)(p_Var15->type == XML_ATTRIBUTE_NODE),in_stack_ffffffffffffff90);
        pxVar6 = (xmlNsMapItemPtr_conflict)&stack0xffffffffffffff88;
        if (iVar4 == -1) {
          uVar11 = 0xffffffff;
          pxVar6 = (xmlNsMapItemPtr_conflict)&stack0xffffffffffffff88;
        }
LAB_0014b72e:
        p_Var15->ns = pxVar6->newNs;
      }
    }
    else {
      if (xVar3 != XML_ELEMENT_NODE) goto LAB_0014b75f;
      iVar14 = iVar14 + 1;
      pxVar5 = p_Var15->nsDef;
      elem_00 = p_Var15;
      if (pxVar5 == (xmlNs *)0x0) goto LAB_0014b649;
      local_38 = p_Var13;
      local_40 = elem;
      pxVar16 = (xmlNs *)0x0;
      bVar18 = true;
      while (local_60 = pxVar5, pxVar5 != (xmlNs *)0x0) {
        if (!bVar1) {
          p_Var13 = (_xmlDoc *)local_40->parent;
          if (((p_Var13 != (_xmlDoc *)0x0) && (p_Var13->doc != p_Var13)) &&
             (iVar4 = xmlDOMWrapNSNormGatherInScopeNs(&nsMap,(xmlNodePtr)p_Var13), iVar4 == -1)) {
            uVar11 = 0xffffffff;
          }
          bVar1 = true;
        }
        if (((nsMap != (xmlNsMapPtr)0x0 & (byte)local_48) == 1) &&
           (pxVar6 = nsMap->first, pxVar6 != (xmlNsMapItemPtr_conflict)0x0)) {
          for (; pxVar6 != (xmlNsMapItemPtr_conflict)0x0; pxVar6 = pxVar6->next) {
            uVar8 = uVar11;
            if ((-2 < pxVar6->depth) && (pxVar6->shadowDepth == -1)) {
              newNs = pxVar6->newNs;
              if (local_60->prefix != newNs->prefix) {
                iVar4 = xmlStrEqual(local_60->prefix,newNs->prefix);
                if (iVar4 == 0) goto LAB_0014b4f6;
                newNs = pxVar6->newNs;
              }
              if (local_60->href != newNs->href) {
                iVar4 = xmlStrEqual(local_60->href,newNs->href);
                if (iVar4 == 0) goto LAB_0014b4f6;
                newNs = pxVar6->newNs;
              }
              iVar4 = xmlDOMWrapNSNormAddNsMapItem2
                                (&listRedund,&sizeRedund,&nbRedund,local_60,newNs);
              uVar8 = 0xffffffff;
              if (iVar4 != -1) {
                if (pxVar16 == (xmlNs *)0x0) {
                  p_Var15->nsDef = local_60->next;
                  pxVar16 = (xmlNs *)0x0;
                }
                else {
                  pxVar16->next = local_60->next;
                }
                goto LAB_0014b619;
              }
            }
LAB_0014b4f6:
            uVar11 = uVar8;
          }
        }
        bVar2 = bVar18 && p_Var15->ns != local_60;
        if (p_Var15->ns == (xmlNs *)0x0) {
          bVar2 = bVar18;
        }
        if ((nsMap != (xmlNsMapPtr)0x0) &&
           (pxVar6 = nsMap->first, pxVar6 != (xmlNsMapItemPtr_conflict)0x0)) {
          for (; pxVar6 != (xmlNsMapItemPtr_conflict)0x0; pxVar6 = pxVar6->next) {
            if ((-2 < pxVar6->depth) && (pxVar6->shadowDepth == -1)) {
              str2 = pxVar6->newNs->prefix;
              if ((local_60->prefix == str2) ||
                 (iVar4 = xmlStrEqual(local_60->prefix,str2), iVar4 != 0)) {
                pxVar6->shadowDepth = iVar14;
              }
            }
          }
        }
        pxVar6 = xmlDOMWrapNsMapAddItem(&nsMap,-1,local_60,local_60,iVar14);
        uVar11 = uVar11 | -(uint)(pxVar6 == (xmlNsMapItemPtr_conflict)0x0);
        pxVar16 = local_60;
        bVar18 = bVar2;
LAB_0014b619:
        pxVar5 = local_60->next;
      }
      p_Var13 = local_38;
      elem = local_40;
      if (bVar18) goto LAB_0014b649;
    }
    if (p_Var15->type != XML_ELEMENT_NODE) goto LAB_0014b75f;
    p_Var9 = (_xmlNode *)p_Var15->properties;
    if (p_Var9 == (_xmlNode *)0x0) {
      while (p_Var9 = p_Var15->children, p_Var9 == (_xmlNode *)0x0) {
LAB_0014b75f:
        do {
          ppxVar7 = listRedund;
          if (p_Var15 == elem) {
            if (listRedund != (xmlNsPtr *)0x0) {
              ppxVar17 = listRedund;
              iVar14 = 0;
              if (0 < nbRedund) {
                iVar14 = nbRedund;
              }
              while (iVar14 != 0) {
                xmlFreeNs(*ppxVar17);
                ppxVar17 = ppxVar17 + 2;
                iVar14 = iVar14 + -1;
              }
              (*xmlFree)(ppxVar7);
            }
            if (nsMap == (xmlNsMapPtr)0x0) {
              return uVar11;
            }
            xmlDOMWrapNsMapFree(nsMap);
            return uVar11;
          }
          xVar3 = p_Var15->type;
          if (xVar3 == XML_ELEMENT_NODE) {
            if ((nsMap != (xmlNsMapPtr)0x0) && (nsMap->first != (xmlNsMapItemPtr_conflict)0x0)) {
              while ((pxVar6 = nsMap->last, pxVar10 = (xmlNsMapItemPtr_conflict)nsMap,
                     pxVar6 != (xmlNsMapItemPtr_conflict)0x0 && (iVar14 <= pxVar6->depth))) {
                pxVar12 = pxVar6->prev;
                nsMap->last = pxVar12;
                if (pxVar12 == (xmlNsMapItemPtr)0x0) {
                  pxVar12 = (xmlNsMapItemPtr)nsMap;
                }
                pxVar12->next = (xmlNsMapItemPtr_conflict)0x0;
                pxVar6->next = nsMap->pool;
                nsMap->pool = pxVar6;
              }
              while (pxVar10 = pxVar10->next, pxVar10 != (xmlNsMapItemPtr_conflict)0x0) {
                if (iVar14 <= pxVar10->shadowDepth) {
                  pxVar10->shadowDepth = -1;
                }
              }
            }
            iVar14 = iVar14 + -1;
          }
          p_Var9 = p_Var15->next;
          if (p_Var9 != (_xmlNode *)0x0) goto LAB_0014b745;
          p_Var15 = p_Var15->parent;
        } while ((xVar3 != XML_ATTRIBUTE_NODE) || (p_Var15->type != XML_ELEMENT_NODE));
      }
    }
LAB_0014b745:
    xVar3 = p_Var9->type;
    p_Var15 = p_Var9;
  } while( true );
}

Assistant:

int
xmlDOMWrapReconcileNamespaces(xmlDOMWrapCtxtPtr ctxt ATTRIBUTE_UNUSED,
			      xmlNodePtr elem,
			      int options)
{
    int depth = -1, adoptns = 0, parnsdone = 0;
    xmlNsPtr ns, prevns;
    xmlDocPtr doc;
    xmlNodePtr cur, curElem = NULL;
    xmlNsMapPtr nsMap = NULL;
    xmlNsMapItemPtr /* topmi = NULL, */ mi;
    /* @ancestorsOnly should be set by an option flag. */
    int ancestorsOnly = 0;
    int optRemoveRedundantNS =
	((xmlDOMReconcileNSOptions) options & XML_DOM_RECONNS_REMOVEREDUND) ? 1 : 0;
    xmlNsPtr *listRedund = NULL;
    int sizeRedund = 0, nbRedund = 0, ret = 0, i, j;

    if ((elem == NULL) || (elem->doc == NULL) ||
	(elem->type != XML_ELEMENT_NODE))
	return (-1);

    doc = elem->doc;
    cur = elem;
    do {
	switch (cur->type) {
	    case XML_ELEMENT_NODE:
		adoptns = 1;
		curElem = cur;
		depth++;
		/*
		* Namespace declarations.
		*/
		if (cur->nsDef != NULL) {
		    prevns = NULL;
		    ns = cur->nsDef;
		    while (ns != NULL) {
			if (! parnsdone) {
			    if ((elem->parent) &&
				((xmlNodePtr) elem->parent->doc != elem->parent)) {
				/*
				* Gather ancestor in-scope ns-decls.
				*/
				if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
				    elem->parent) == -1)
				    ret = -1;
			    }
			    parnsdone = 1;
			}

			/*
			* Lookup the ns ancestor-axis for equal ns-decls in scope.
			*/
			if (optRemoveRedundantNS && XML_NSMAP_NOTEMPTY(nsMap)) {
			    XML_NSMAP_FOREACH(nsMap, mi) {
				if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
				    (mi->shadowDepth == -1) &&
				    ((ns->prefix == mi->newNs->prefix) ||
				      xmlStrEqual(ns->prefix, mi->newNs->prefix)) &&
				    ((ns->href == mi->newNs->href) ||
				      xmlStrEqual(ns->href, mi->newNs->href)))
				{
				    /*
				    * A redundant ns-decl was found.
				    * Add it to the list of redundant ns-decls.
				    */
				    if (xmlDOMWrapNSNormAddNsMapItem2(&listRedund,
					&sizeRedund, &nbRedund, ns, mi->newNs) == -1) {
					ret = -1;
                                    } else {
                                        /*
                                        * Remove the ns-decl from the element-node.
                                        */
                                        if (prevns)
                                            prevns->next = ns->next;
                                        else
                                            cur->nsDef = ns->next;
                                        goto next_ns_decl;
                                    }
				}
			    }
			}

			/*
			* Skip ns-references handling if the referenced
			* ns-decl is declared on the same element.
			*/
			if ((cur->ns != NULL) && adoptns && (cur->ns == ns))
			    adoptns = 0;
			/*
			* Does it shadow any ns-decl?
			*/
			if (XML_NSMAP_NOTEMPTY(nsMap)) {
			    XML_NSMAP_FOREACH(nsMap, mi) {
				if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
				    (mi->shadowDepth == -1) &&
				    ((ns->prefix == mi->newNs->prefix) ||
				    xmlStrEqual(ns->prefix, mi->newNs->prefix))) {

				    mi->shadowDepth = depth;
				}
			    }
			}
			/*
			* Push mapping.
			*/
			if (xmlDOMWrapNsMapAddItem(&nsMap, -1, ns, ns,
			    depth) == NULL)
			    ret = -1;

			prevns = ns;
next_ns_decl:
			ns = ns->next;
		    }
		}
		if (! adoptns)
		    goto ns_end;
                /* Falls through. */
	    case XML_ATTRIBUTE_NODE:
		/* No ns, no fun. */
		if (cur->ns == NULL)
		    goto ns_end;

		if (! parnsdone) {
		    if ((elem->parent) &&
			((xmlNodePtr) elem->parent->doc != elem->parent)) {
			if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
				elem->parent) == -1)
			    ret = -1;
		    }
		    parnsdone = 1;
		}
		/*
		* Adjust the reference if this was a redundant ns-decl.
		*/
		if (listRedund) {
		   for (i = 0, j = 0; i < nbRedund; i++, j += 2) {
		       if (cur->ns == listRedund[j]) {
			   cur->ns = listRedund[++j];
			   break;
		       }
		   }
		}
		/*
		* Adopt ns-references.
		*/
		if (XML_NSMAP_NOTEMPTY(nsMap)) {
		    /*
		    * Search for a mapping.
		    */
		    XML_NSMAP_FOREACH(nsMap, mi) {
			if ((mi->shadowDepth == -1) &&
			    (cur->ns == mi->oldNs)) {

			    cur->ns = mi->newNs;
			    goto ns_end;
			}
		    }
		}
		/*
		* Acquire a normalized ns-decl and add it to the map.
		*/
		if (xmlDOMWrapNSNormAcquireNormalizedNs(doc, curElem,
			cur->ns, &ns,
			&nsMap, depth,
			ancestorsOnly,
			(cur->type == XML_ATTRIBUTE_NODE) ? 1 : 0) == -1)
		    ret = -1;
		cur->ns = ns;

ns_end:
		if ((cur->type == XML_ELEMENT_NODE) &&
		    (cur->properties != NULL)) {
		    /*
		    * Process attributes.
		    */
		    cur = (xmlNodePtr) cur->properties;
		    continue;
		}
		break;
	    default:
		goto next_sibling;
	}
into_content:
	if ((cur->type == XML_ELEMENT_NODE) &&
	    (cur->children != NULL)) {
	    /*
	    * Process content of element-nodes only.
	    */
	    cur = cur->children;
	    continue;
	}
next_sibling:
	if (cur == elem)
	    break;
	if (cur->type == XML_ELEMENT_NODE) {
	    if (XML_NSMAP_NOTEMPTY(nsMap)) {
		/*
		* Pop mappings.
		*/
		while ((nsMap->last != NULL) &&
		    (nsMap->last->depth >= depth))
		{
		    XML_NSMAP_POP(nsMap, mi)
		}
		/*
		* Unshadow.
		*/
		XML_NSMAP_FOREACH(nsMap, mi) {
		    if (mi->shadowDepth >= depth)
			mi->shadowDepth = -1;
		}
	    }
	    depth--;
	}
	if (cur->next != NULL)
	    cur = cur->next;
	else {
	    if (cur->type == XML_ATTRIBUTE_NODE) {
		cur = cur->parent;
		goto into_content;
	    }
	    cur = cur->parent;
	    goto next_sibling;
	}
    } while (cur != NULL);

    if (listRedund) {
	for (i = 0, j = 0; i < nbRedund; i++, j += 2) {
	    xmlFreeNs(listRedund[j]);
	}
	xmlFree(listRedund);
    }
    if (nsMap != NULL)
	xmlDOMWrapNsMapFree(nsMap);
    return (ret);
}